

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmGetDirectoryPropertyCommand::InitialPass
          (cmGetDirectoryPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  size_type sVar4;
  reference pbVar5;
  cmGlobalGenerator *this_01;
  ulong uVar6;
  char *pcVar7;
  PolicyID id;
  string local_1a8;
  char *local_188;
  char *prop;
  string local_178 [8];
  string output;
  string local_150;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  allocator local_121;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  string sd;
  string local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  cmMakefile *local_90;
  cmMakefile *dir;
  string variable;
  const_iterator i;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetDirectoryPropertyCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_005c0522;
  }
  variable.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  this_00 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(&variable.field_2._M_allocated_capacity + 1);
  pbVar5 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this_00);
  std::__cxx11::string::string((string *)&dir,(string *)pbVar5);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this_00);
  local_90 = (this->super_cmCommand).Makefile;
  pbVar5 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this_00);
  bVar2 = std::operator==(pbVar5,"DIRECTORY");
  if (bVar2) {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&variable.field_2 + 8));
    local_98._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&variable.field_2 + 8),&local_98);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,"DIRECTORY argument provided without subsequent arguments",
                 (allocator *)(sd.field_2._M_local_buf + 0xf));
      cmCommand::SetError(&this->super_cmCommand,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)(sd.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      sd.field_2._8_4_ = 1;
    }
    else {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&variable.field_2 + 8));
      std::__cxx11::string::string((string *)local_e0,(string *)pbVar5);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar7);
      if (!bVar2) {
        pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::operator=((string *)local_e0,pcVar7);
        std::__cxx11::string::operator+=((string *)local_e0,"/");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&variable.field_2 + 8));
        std::__cxx11::string::operator+=((string *)local_e0,(string *)pbVar5);
      }
      cmsys::SystemTools::CollapseFullPath(&local_100,(string *)local_e0);
      std::__cxx11::string::operator=((string *)local_e0,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      local_90 = cmGlobalGenerator::FindMakefile(this_01,(string *)local_e0);
      bVar2 = local_90 != (cmMakefile *)0x0;
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&variable.field_2 + 8));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,
                   "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,&local_121);
        cmCommand::SetError(&this->super_cmCommand,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        this_local._7_1_ = 0;
      }
      sd.field_2._9_3_ = 0;
      sd.field_2._M_local_buf[8] = !bVar2;
      std::__cxx11::string::~string((string *)local_e0);
      if (sd.field_2._8_4_ == 0) goto LAB_005c015e;
    }
  }
  else {
LAB_005c015e:
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&variable.field_2 + 8));
    bVar2 = std::operator==(pbVar5,"DEFINITION");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&variable.field_2 + 8));
      local_130._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&variable.field_2 + 8),&local_130);
      pcVar1 = local_90;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,
                   "A request for a variable definition was made without providing the name of the variable to get."
                   ,(allocator *)(output.field_2._M_local_buf + 0xf));
        cmCommand::SetError(&this->super_cmCommand,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        sd.field_2._8_4_ = 1;
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&variable.field_2 + 8));
        pcVar7 = cmMakefile::GetSafeDefinition(pcVar1,pbVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,pcVar7,(allocator *)((long)&prop + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&prop + 7));
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)&dir,pcVar7);
        this_local._7_1_ = 1;
        sd.field_2._8_4_ = 1;
        std::__cxx11::string::~string(local_178);
      }
    }
    else {
      local_188 = (char *)0x0;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&variable.field_2 + 8));
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&variable.field_2 + 8));
        bVar2 = std::operator==(pbVar5,"DEFINITIONS");
        if (bVar2) {
          PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0059);
          if (PVar3 != OLD) {
            if (PVar3 != WARN) goto LAB_005c04a8;
            pcVar1 = (this->super_cmCommand).Makefile;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1a8,(cmPolicies *)0x3b,id);
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1a8,false);
            std::__cxx11::string::~string((string *)&local_1a8);
          }
          pcVar7 = cmMakefile::GetDefineFlagsCMP0059((this->super_cmCommand).Makefile);
          StoreResult(this,(string *)&dir,pcVar7);
          this_local._7_1_ = 1;
          sd.field_2._8_4_ = 1;
          goto LAB_005c050c;
        }
LAB_005c04a8:
        pcVar1 = local_90;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&variable.field_2 + 8));
        local_188 = cmMakefile::GetProperty(pcVar1,pbVar5);
      }
      StoreResult(this,(string *)&dir,local_188);
      this_local._7_1_ = 1;
      sd.field_2._8_4_ = 1;
    }
  }
LAB_005c050c:
  std::__cxx11::string::~string((string *)&dir);
LAB_005c0522:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetDirectoryPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile *dir = this->Makefile;
  if (*i == "DIRECTORY")
    {
    ++i;
    if (i == args.end())
      {
      this->SetError
        ("DIRECTORY argument provided without subsequent arguments");
      return false;
      }
    std::string sd = *i;
    // make sure the start dir is a full path
    if (!cmSystemTools::FileIsFullPath(sd.c_str()))
      {
      sd = this->Makefile->GetCurrentSourceDirectory();
      sd += "/";
      sd += *i;
      }

    // The local generators are associated with collapsed paths.
    sd = cmSystemTools::CollapseFullPath(sd);

    // lookup the makefile from the directory name
    dir = this->Makefile->GetGlobalGenerator()->FindMakefile(sd);
    if (!dir)
      {
      this->SetError
        ("DIRECTORY argument provided but requested directory not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    ++i;
    }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if ( *i == "DEFINITION" )
    {
    ++i;
    if (i == args.end())
      {
      this->SetError("A request for a variable definition was made without "
                     "providing the name of the variable to get.");
      return false;
      }
    std::string output = dir->GetSafeDefinition(*i);
    this->Makefile->AddDefinition(variable, output.c_str());
    return true;
    }

  const char *prop = 0;
  if (!i->empty())
    {
    if (*i == "DEFINITIONS")
      {
      switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0059))
        {
        case cmPolicies::WARN:
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        case cmPolicies::OLD:
          this->StoreResult(variable,
                                   this->Makefile->GetDefineFlagsCMP0059());
        return true;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
        }
      }
    prop = dir->GetProperty(*i);
    }
  this->StoreResult(variable, prop);
  return true;
}